

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
  this_00;
  bool bVar1;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>_>
  *this_01;
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
  local_10;
  
  this_00._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
       .
       super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
       ._M_head_impl;
  if (this_00._M_head_impl != (FastGeneralizationsIterator *)0x0) {
    bVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
            FastGeneralizationsIterator::keepRecycled(this_00._M_head_impl);
    if ((bVar1) &&
       (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
        ::memAlive == '\x01')) {
      Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
      FastGeneralizationsIterator::reset
                ((this->_self)._M_t.
                 super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
                 .
                 super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
                 ._M_head_impl);
      this_01 = mem();
      local_10._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
           ._M_t.
           super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
           .
           super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
           ._M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator_*,_false>
      ._M_head_impl = (FastGeneralizationsIterator *)0x0;
      Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>_>
      ::push(this_01,(unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
                      *)&local_10);
      std::
      unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
      ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
                     *)&local_10);
    }
  }
  std::
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }